

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O2

Epoch __thiscall
anon_unknown.dwarf_28c2bc::SQLiteBuildDB::getCurrentEpoch
          (SQLiteBuildDB *this,bool *success_out,string *error_out)

{
  int iVar1;
  Epoch EVar2;
  int __oflag;
  sqlite3_stmt *stmt;
  string local_40;
  
  std::mutex::lock(&this->dbMutex);
  iVar1 = open(this,(char *)error_out,__oflag);
  if ((char)iVar1 == '\0') {
    *success_out = false;
  }
  else {
    iVar1 = sqlite3_prepare_v2(this->db,"SELECT iteration FROM info LIMIT 1",0xffffffffffffffff,
                               &stmt,0);
    if (iVar1 == 0) {
      iVar1 = sqlite3_step(stmt);
      if (iVar1 == 100) {
        iVar1 = sqlite3_column_count(stmt);
        if (iVar1 != 1) {
          __assert_fail("sqlite3_column_count(stmt) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                        ,0x183,
                        "virtual Epoch (anonymous namespace)::SQLiteBuildDB::getCurrentEpoch(bool *, std::string *)"
                       );
        }
        EVar2 = sqlite3_column_int64(stmt,0);
        sqlite3_finalize(stmt);
        *success_out = true;
        goto LAB_0015633d;
      }
      *success_out = false;
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_40,this);
      std::__cxx11::string::operator=((string *)error_out,(string *)&local_40);
      std::__cxx11::string::_M_dispose();
      sqlite3_finalize(stmt);
    }
    else {
      *success_out = false;
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_40,this);
      std::__cxx11::string::operator=((string *)error_out,(string *)&local_40);
      std::__cxx11::string::_M_dispose();
    }
  }
  EVar2 = 0;
LAB_0015633d:
  pthread_mutex_unlock((pthread_mutex_t *)&this->dbMutex);
  return EVar2;
}

Assistant:

virtual Epoch getCurrentEpoch(bool* success_out, std::string *error_out) override {
    std::lock_guard<std::mutex> guard(dbMutex);

    if (!open(error_out)) {
      *success_out = false;
      return 0;
    }

    // Fetch the iteration from the info table.
    sqlite3_stmt* stmt;
    int result;
    result = sqlite3_prepare_v2(
      db, "SELECT iteration FROM info LIMIT 1",
      -1, &stmt, nullptr);
    if (result != SQLITE_OK) {
      *success_out = false;
      *error_out = getCurrentErrorMessage();
      return 0;
    }

    result = sqlite3_step(stmt);
    if (result != SQLITE_ROW) {
      *success_out = false;
      *error_out = getCurrentErrorMessage();
      sqlite3_finalize(stmt);
      return 0;
    }

    assert(sqlite3_column_count(stmt) == 1);
    uint64_t iteration = sqlite3_column_int64(stmt, 0);

    sqlite3_finalize(stmt);

    *success_out = true;
    return iteration;
  }